

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void initialise_mcurve(ec_curve *curve,mp_int *p,mp_int *a,mp_int *b,mp_int *G_x,uint log2_cofactor)

{
  MontgomeryCurve *pMVar1;
  MontgomeryPoint *pMVar2;
  uint log2_cofactor_local;
  mp_int *G_x_local;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *p_local;
  ec_curve *curve_local;
  
  initialise_common(curve,EC_MONTGOMERY,p,0);
  pMVar1 = ecc_montgomery_curve(p,a,b);
  (curve->field_6).m.mc = pMVar1;
  (curve->field_6).m.log2_cofactor = log2_cofactor;
  pMVar2 = ecc_montgomery_point_new((curve->field_6).m.mc,G_x);
  (curve->field_6).m.G = pMVar2;
  return;
}

Assistant:

static void initialise_mcurve(
    struct ec_curve *curve, mp_int *p, mp_int *a, mp_int *b,
    mp_int *G_x, unsigned log2_cofactor)
{
    initialise_common(curve, EC_MONTGOMERY, p, 0);

    curve->m.mc = ecc_montgomery_curve(p, a, b);
    curve->m.log2_cofactor = log2_cofactor;

    curve->m.G = ecc_montgomery_point_new(curve->m.mc, G_x);
}